

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_headers_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_stream *stream_00;
  nghttp2_session *in_RDI;
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  uint8_t *in_stack_ffffffffffffffd8;
  nghttp2_frame *frame_00;
  nghttp2_session *session_00;
  int local_4;
  
  frame_00 = &(in_RDI->iframe).frame;
  session_00 = (nghttp2_session *)frame_00;
  nghttp2_frame_unpack_headers_payload(&frame_00->headers,in_stack_ffffffffffffffd8);
  stream_00 = nghttp2_session_get_stream(session_00,(int32_t)((ulong)frame_00 >> 0x20));
  if (stream_00 == (nghttp2_stream *)0x0) {
    (frame_00->headers).cat = NGHTTP2_HCAT_REQUEST;
    local_4 = nghttp2_session_on_request_headers_received(session_00,frame_00);
  }
  else if (stream_00->state == NGHTTP2_STREAM_RESERVED) {
    (frame_00->headers).cat = NGHTTP2_HCAT_PUSH_RESPONSE;
    local_4 = nghttp2_session_on_push_response_headers_received(session_00,frame_00,stream_00);
  }
  else {
    if ((stream_00->state == NGHTTP2_STREAM_OPENING) &&
       (iVar1 = nghttp2_session_is_my_stream_id(in_RDI,(frame_00->hd).stream_id), iVar1 != 0)) {
      (frame_00->headers).cat = NGHTTP2_HCAT_RESPONSE;
      iVar1 = nghttp2_session_on_response_headers_received(session_00,frame_00,stream_00);
      return iVar1;
    }
    (frame_00->headers).cat = NGHTTP2_HCAT_HEADERS;
    local_4 = nghttp2_session_on_headers_received(session_00,frame_00,stream_00);
  }
  return local_4;
}

Assistant:

static int session_process_headers_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;
  nghttp2_stream *stream;

  nghttp2_frame_unpack_headers_payload(&frame->headers, iframe->sbuf.pos);

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (!stream) {
    frame->headers.cat = NGHTTP2_HCAT_REQUEST;
    return nghttp2_session_on_request_headers_received(session, frame);
  }

  if (stream->state == NGHTTP2_STREAM_RESERVED) {
    frame->headers.cat = NGHTTP2_HCAT_PUSH_RESPONSE;
    return nghttp2_session_on_push_response_headers_received(session, frame,
                                                             stream);
  }

  if (stream->state == NGHTTP2_STREAM_OPENING &&
      nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)) {
    frame->headers.cat = NGHTTP2_HCAT_RESPONSE;
    return nghttp2_session_on_response_headers_received(session, frame, stream);
  }

  frame->headers.cat = NGHTTP2_HCAT_HEADERS;
  return nghttp2_session_on_headers_received(session, frame, stream);
}